

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

PendingExecutionResult __thiscall
duckdb::ClientContext::ExecuteTaskInternal
          (ClientContext *this,ClientContextLock *lock,BaseQueryResult *result,bool dry_run)

{
  unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
  *this_00;
  PendingExecutionResult PVar1;
  pointer pAVar2;
  pointer this_01;
  pointer pPVar3;
  ErrorData error;
  QueryProgress local_3b0 [37];
  
  this_00 = &this->active_query;
  pAVar2 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
           ::operator->(this_00);
  this_01 = unique_ptr<duckdb::Executor,_std::default_delete<duckdb::Executor>,_true>::operator->
                      (&pAVar2->executor);
  PVar1 = Executor::ExecuteTask(this_01,dry_run);
  pAVar2 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
           ::operator->(this_00);
  if ((pAVar2->progress_bar).
      super_unique_ptr<duckdb::ProgressBar,_std::default_delete<duckdb::ProgressBar>_>._M_t.
      super___uniq_ptr_impl<duckdb::ProgressBar,_std::default_delete<duckdb::ProgressBar>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ProgressBar_*,_std::default_delete<duckdb::ProgressBar>_>.
      super__Head_base<0UL,_duckdb::ProgressBar_*,_false>._M_head_impl != (ProgressBar *)0x0) {
    pAVar2 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
             ::operator->(this_00);
    pPVar3 = unique_ptr<duckdb::ProgressBar,_std::default_delete<duckdb::ProgressBar>,_true>::
             operator->(&pAVar2->progress_bar);
    ProgressBar::Update(pPVar3,PVar1 == EXECUTION_FINISHED ||
                               (PVar1 & ~EXECUTION_ERROR) == RESULT_READY);
    pAVar2 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
             ::operator->(this_00);
    pPVar3 = unique_ptr<duckdb::ProgressBar,_std::default_delete<duckdb::ProgressBar>,_true>::
             operator->(&pAVar2->progress_bar);
    ProgressBar::GetDetailedQueryProgress(local_3b0,pPVar3);
    QueryProgress::operator=(&this->query_progress,local_3b0);
  }
  return PVar1;
}

Assistant:

PendingExecutionResult ClientContext::ExecuteTaskInternal(ClientContextLock &lock, BaseQueryResult &result,
                                                          bool dry_run) {
	D_ASSERT(active_query);
	D_ASSERT(active_query->IsOpenResult(result));
	bool invalidate_transaction = true;
	try {
		auto query_result = active_query->executor->ExecuteTask(dry_run);
		if (active_query->progress_bar) {
			auto is_finished = PendingQueryResult::IsResultReady(query_result);
			active_query->progress_bar->Update(is_finished);
			query_progress = active_query->progress_bar->GetDetailedQueryProgress();
		}
		return query_result;
	} catch (std::exception &ex) {
		auto error = ErrorData(ex);
		if (error.Type() == ExceptionType::INTERRUPT) {
			auto &executor = *active_query->executor;
			if (!executor.HasError()) {
				// Interrupted by the user
				result.SetError(ex);
				invalidate_transaction = true;
			} else {
				// Interrupted by an exception caused in a worker thread
				error = executor.GetError();
				invalidate_transaction = Exception::InvalidatesTransaction(error.Type());
				result.SetError(error);
			}
		} else if (!Exception::InvalidatesTransaction(error.Type())) {
			invalidate_transaction = false;
		} else if (Exception::InvalidatesDatabase(error.Type()) || error.Type() == ExceptionType::INTERNAL) {
			// fatal exceptions invalidate the entire database
			auto &db_instance = DatabaseInstance::GetDatabase(*this);
			ValidChecker::Invalidate(db_instance, error.RawMessage());
		}
		ProcessError(error, active_query->query);
		result.SetError(std::move(error));
	} catch (...) { // LCOV_EXCL_START
		result.SetError(ErrorData("Unhandled exception in ExecuteTaskInternal"));
	} // LCOV_EXCL_STOP
	EndQueryInternal(lock, false, invalidate_transaction, result.GetErrorObject());
	return PendingExecutionResult::EXECUTION_ERROR;
}